

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

uint64 mkvmuxer::WriteVoidElement(IMkvWriter *writer,uint64 size)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  long lVar5;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  uint uVar6;
  ulong uVar7;
  uint8 value;
  uint8 b;
  undefined1 local_2a;
  undefined1 local_29;
  
  if (writer != (IMkvWriter *)0x0) {
    uVar1 = size - 1;
    uVar7 = 0xffffffffffffffff;
    if ((((0x7e < uVar1) && (uVar7 = 0xfffffffffffffffe, 0x3ffe < uVar1)) &&
        (uVar7 = 0xfffffffffffffffd, 0x1ffffe < uVar1)) &&
       (((uVar7 = 0xfffffffffffffffc, 0xffffffe < uVar1 &&
         (uVar7 = 0xfffffffffffffffb, 0x7fffffffe < uVar1)) &&
        (uVar7 = 0xfffffffffffffffa, 0x3fffffffffe < uVar1)))) {
      uVar7 = (ulong)(uVar1 < 0x1ffffffffffff) | 0xfffffffffffffff8;
    }
    uVar7 = uVar7 + uVar1;
    lVar5 = 2;
    if (((0x7e < uVar7) && (lVar5 = 3, 0x3ffe < uVar7)) &&
       ((lVar5 = 4, 0x1ffffe < uVar7 &&
        (((lVar5 = 5, 0xffffffe < uVar7 && (lVar5 = 6, 0x7fffffffe < uVar7)) &&
         (lVar5 = 7, 0x3fffffffffe < uVar7)))))) {
      lVar5 = 9 - (ulong)(uVar7 < 0x1ffffffffffff);
    }
    if (lVar5 + uVar7 == size) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      if (-1 < extraout_var) {
        iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
        (*writer->_vptr_IMkvWriter[4])(writer,0xec,CONCAT44(extraout_var_00,iVar3));
        local_29 = 0xec;
        iVar3 = (**writer->_vptr_IMkvWriter)(writer,&local_29,1);
        if ((-1 < iVar3) && (iVar4 = WriteUInt(writer,uVar7), iVar4 == 0)) {
          local_2a = 0;
          if (0 < (int)uVar7) {
            do {
              iVar3 = (**writer->_vptr_IMkvWriter)(writer,&local_2a,1);
              if (iVar3 != 0) {
                return 0;
              }
              uVar6 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar6;
            } while (uVar6 != 0);
          }
          iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
          if (CONCAT44(extraout_var_01,iVar3) - CONCAT44(extraout_var,iVar2) != size) {
            size = 0;
          }
          if (extraout_var_01 < 0) {
            return 0;
          }
          return size;
        }
      }
    }
  }
  return 0;
}

Assistant:

uint64 WriteVoidElement(IMkvWriter* writer, uint64 size) {
  if (!writer)
    return false;

  // Subtract one for the void ID and the coded size.
  uint64 void_entry_size = size - 1 - GetCodedUIntSize(size - 1);
  uint64 void_size = EbmlMasterElementSize(libwebm::kMkvVoid, void_entry_size) +
                     void_entry_size;

  if (void_size != size)
    return 0;

  const int64 payload_position = writer->Position();
  if (payload_position < 0)
    return 0;

  if (WriteID(writer, libwebm::kMkvVoid))
    return 0;

  if (WriteUInt(writer, void_entry_size))
    return 0;

  const uint8 value = 0;
  for (int32 i = 0; i < static_cast<int32>(void_entry_size); ++i) {
    if (writer->Write(&value, 1))
      return 0;
  }

  const int64 stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64>(void_size))
    return 0;

  return void_size;
}